

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextInstancer.h
# Opt level: O0

void __thiscall Rml::ContextInstancer::ContextInstancer(ContextInstancer *this)

{
  ContextInstancer *this_local;
  
  Releasable::Releasable(&this->super_Releasable);
  (this->super_Releasable)._vptr_Releasable = (_func_int **)&PTR__ContextInstancer_00814eb8;
  return;
}

Assistant:

class RMLUICORE_API ContextInstancer : public Releasable {
public:
	virtual ~ContextInstancer();

	/// Instances a context.
	/// @param[in] name Name of this context.
	/// @param[in] render_manager The render manager used for this context.
	/// @param[in] text_input_handler The text input handler used for this context.
	/// @return The instanced context.
	virtual ContextPtr InstanceContext(const String& name, RenderManager* render_manager, TextInputHandler* text_input_handler) = 0;

	/// Releases a context previously created by this context.
	/// @param[in] context The context to release.
	virtual void ReleaseContext(Context* context) = 0;
}